

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

int runmcmp(runcxdef *ctx)

{
  runsdef *prVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  runsdef *prVar6;
  ushort *puVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  
  prVar6 = ctx->runcxsp;
  prVar1 = prVar6 + -1;
  if (prVar6[-1].runstyp != '\x03') {
    if (prVar6[-1].runstyp != '\x01') {
      ctx->runcxerr->errcxptr->erraac = 0;
      runsign(ctx,0x3ee);
    }
    ctx->runcxsp = prVar1;
    if (prVar1->runstyp == '\x01') {
      lVar9 = prVar6[-1].runsv.runsvnum;
      ctx->runcxsp = prVar6 + -2;
      if (prVar6[-2].runstyp == '\x01') {
        iVar8 = 1;
        if (prVar6[-2].runsv.runsvnum <= lVar9) {
          iVar8 = -(uint)(prVar6[-2].runsv.runsvnum < lVar9);
        }
        return iVar8;
      }
    }
    ctx->runcxerr->errcxptr->erraac = 0;
    runsign(ctx,0x3eb);
  }
  ctx->runcxsp = prVar1;
  if (prVar1->runstyp == '\x03') {
    puVar7 = (ushort *)prVar6[-1].runsv.runsvstr;
    ctx->runcxsp = prVar6 + -2;
    if (prVar6[-2].runstyp == '\x03') {
      uVar4 = *(ushort *)prVar6[-2].runsv.runsvstr;
      uVar5 = *puVar7;
      bVar10 = uVar5 != 2;
      bVar11 = uVar4 != 2;
      if ((bVar11) && (uVar5 != 2)) {
        lVar9 = 0;
        do {
          bVar2 = *(byte *)((long)puVar7 + lVar9 + 2);
          bVar3 = *(byte *)((long)prVar6[-2].runsv.runsvstr + lVar9 + 2);
          if (bVar3 < bVar2) {
            return -1;
          }
          if (bVar3 >= bVar2 && bVar3 != bVar2) {
            return 1;
          }
          iVar8 = (int)lVar9;
          bVar10 = uVar5 - 3 != iVar8;
          bVar11 = uVar4 - 3 != iVar8;
        } while ((bVar11) && (lVar9 = lVar9 + 1, uVar5 - 3 != iVar8));
      }
      if (bVar11) {
        return 1;
      }
      return -(uint)bVar10;
    }
  }
  ctx->runcxerr->errcxptr->erraac = 0;
  runsign(ctx,0x3ef);
}

Assistant:

int runmcmp(runcxdef *ctx)
{
    if (runtostyp(ctx) == DAT_NUMBER)
    {
        long num2 = runpopnum(ctx);
        long num1 = runpopnum(ctx);
        
        if (num1 > num2) return(1);
        else if (num1 < num2) return(-1);
        else return(0);
    }
    else if (runtostyp(ctx) == DAT_SSTRING)
    {
        uchar *str2 = runpopstr(ctx);
        uchar *str1 = runpopstr(ctx);
        uint   len1 = osrp2(str1) - 2;
        uint   len2 = osrp2(str2) - 2;
        
        str1 += 2;
        str2 += 2;
        while (len1 && len2)
        {
            if (*str1 < *str2) return(-1);   /* character from 1 is greater */
            else if (*str1 > *str2) return(1);       /* char from 1 is less */
            
            ++str1;
            ++str2;
            --len1;
            --len2;
        }
        if (len1) return(1);    /* match up to len2, but string 1 is longer */
        else if (len2) return(-1);  /* match up to len1, but str2 is longer */
        else return(0);                            /* strings are identical */
    }
    else
    {
        runsig(ctx, ERR_INVCMP);
    }
    return 0;
}